

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test::
~DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test
          (DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test *this)

{
  DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test *this_local;
  
  ~DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DebugCounterTest, NoopDoesNotProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::NoopDebugCounter counter1;
        static google::protobuf::internal::NoopDebugCounter counter2;
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(false));

  // and test that the operations have no side effects.
  static_assert((google::protobuf::internal::NoopDebugCounter().Inc(), true), "");
}